

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O2

Ray * __thiscall
pbrt::Interaction::SpawnRayTo(Ray *__return_storage_ptr__,Interaction *this,Point3f *p2)

{
  Interval local_20;
  
  pbrt::SpawnRayTo(__return_storage_ptr__,(pbrt *)this,
                   (Point3fi)
                   (this->pi).super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>,
                   (Normal3f)(this->n).super_Tuple3<pbrt::Normal3,_float>,this->time,
                   (Point3f)p2->super_Tuple3<pbrt::Point3,_float>);
  GetMedium((Interaction *)&stack0xffffffffffffffe0,(Vector3f *)this);
  (__return_storage_ptr__->medium).
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (uintptr_t)local_20;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    Ray SpawnRayTo(const Point3f &p2) const {
        Ray r = pbrt::SpawnRayTo(pi, n, time, p2);
        r.medium = GetMedium(r.d);
        return r;
    }